

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  char *pcVar3;
  bool bVar4;
  slot_type *psVar5;
  uint64_t uVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  undefined8 uVar10;
  byte bVar11;
  uint64_t v_1;
  ctrl_t cVar12;
  uint64_t v;
  ulong uVar13;
  size_t sVar14;
  FindInfo FVar15;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                 );
  }
  sVar8 = common->capacity_;
  if (sVar8 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                 );
  }
  bVar9 = 0x80;
  if (sVar8 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)common);
    if (1 < common->size_) {
      psVar5 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)common);
      uVar1 = psVar5->_M_len;
      uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                        (&hash_internal::MixingHashState::kSeed,psVar5->_M_str,uVar1);
      bVar9 = (byte)((uVar6 ^ uVar1) * 0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar11 = 1;
      goto LAB_00621b05;
    }
  }
  bVar11 = 0;
LAB_00621b05:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar8 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  local_3e = bVar11;
  CommonFields::set_capacity(common,new_capacity);
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar9,0x10,0x10);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                 );
  }
  if ((bVar11 | sVar8 != 1) == 1) {
    psVar5 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)common);
    uVar10 = local_58.heap.control;
    if (!bVar4) {
      if (sVar8 == 1) {
        uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                          (&hash_internal::MixingHashState::kSeed,local_58.heap.slot_array.p,
                           local_58.heap.control);
        uVar13 = (uVar6 ^ uVar10) * -0x234dd359734ecb13;
        FVar15 = find_first_non_full<void>
                           (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                   (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8
                                   | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38);
        uVar7 = FVar15.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar7) {
LAB_00621d3f:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar7] = cVar12;
        pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar7 - 0xf & uVar1)] = cVar12;
        common->capacity_ = 0xffffffffffffff9c;
        psVar5[uVar7]._M_len = (size_t)local_58.heap.control;
        psVar5[uVar7]._M_str = (char *)local_58.heap.slot_array;
        CommonFields::set_capacity(common,uVar1);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar14 = 0;
          sVar8 = local_48;
          uVar10 = local_58.heap.slot_array;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar14]) {
              uVar1 = *(ulong *)uVar10;
              uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,*(ulong *)(uVar10 + 8),uVar1
                                );
              uVar13 = (uVar6 ^ uVar1) * -0x234dd359734ecb13;
              FVar15 = find_first_non_full<void>
                                 (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                         (uVar13 & 0xff0000000000) >> 0x18 |
                                         (uVar13 & 0xff00000000) >> 8 | (uVar13 & 0xff000000) << 8 |
                                         (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
                                         uVar13 << 0x38);
              uVar7 = FVar15.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar7) goto LAB_00621d3f;
              cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar7] = cVar12;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar7 - 0xf & uVar1)] = cVar12;
              common->capacity_ = 0xffffffffffffff9c;
              pcVar3 = *(char **)(uVar10 + 8);
              psVar5[uVar7]._M_len = *(ulong *)uVar10;
              psVar5[uVar7]._M_str = pcVar3;
              CommonFields::set_capacity(common,uVar1);
              sVar8 = local_48;
            }
            sVar14 = sVar14 + 1;
            uVar10 = uVar10 + 0x10;
          } while (sVar14 != sVar8);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,0x10);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }